

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestExtends2::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  undefined6 in_register_00000032;
  DispatchCallResult DVar1;
  
  DVar1 = ::capnp::Capability::Server::internalUnimplemented
                    ((Server *)this,
                     (char *)((long)CONCAT62(in_register_00000032,methodId) +
                             *(long *)(*(long *)CONCAT62(in_register_00000032,methodId) + -0x18)),
                     0x57857b,0x8783);
  DVar1.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar1;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestExtends2::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestExtends2",
          0x98d7e0ef61488783ull, methodId);
  }
}